

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void cpu_instr_sbc(gb_cpu_t *cpu,uint8_t value)

{
  uint uVar1;
  uint uVar2;
  int result;
  int carry;
  uint8_t value_local;
  gb_cpu_t *cpu_local;
  
  uVar1 = (int)(uint)(cpu->field_0).field_0.reg_f >> 4 & 1;
  uVar2 = ((uint)(cpu->field_0).field_0.reg_a - (uint)value) - uVar1;
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0x7f | ((uVar2 & 0xff) == 0) << 7;
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0xbf | 0x40;
  (cpu->field_0).field_0.reg_f =
       (cpu->field_0).field_0.reg_f & 0xdf |
       ((int)((((cpu->field_0).field_0.reg_a & 0xf) - (value & 0xf)) - uVar1) < 0) << 5;
  (cpu->field_0).field_0.reg_f = (cpu->field_0).field_0.reg_f & 0xef | ((int)uVar2 < 0) << 4;
  (cpu->field_0).field_0.reg_a = (uint8_t)uVar2;
  return;
}

Assistant:

static inline void cpu_instr_sbc(gb_cpu_t *cpu, uint8_t value)
{
    int carry = GET_C();
    int result = cpu->reg_a - value - carry;

    SET_Z(ZERO_CHECK(result));
    SET_N(1);
    SET_H((cpu->reg_a & 0xF) - (value & 0xF) - carry < 0);
    SET_C(result < 0);

    cpu->reg_a = result;
}